

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O0

void server_ping_all(void *server_void)

{
  EOClient *this;
  bool bVar1;
  pair<unsigned_short,_unsigned_char> pVar2;
  reference ppCVar3;
  undefined1 local_78 [8];
  PacketBuilder builder;
  pair<unsigned_short,_unsigned_char> seq_bytes;
  EOClient *client;
  Client *rawclient;
  iterator __end1;
  iterator __begin1;
  list<Client_*,_std::allocator<Client_*>_> *__range1;
  EOServer *server;
  void *server_void_local;
  
  __end1 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::begin
                     ((list<Client_*,_std::allocator<Client_*>_> *)((long)server_void + 0x38));
  rawclient = (Client *)
              std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::end
                        ((list<Client_*,_std::allocator<Client_*>_> *)((long)server_void + 0x38));
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&rawclient);
    if (!bVar1) break;
    ppCVar3 = std::_List_iterator<Client_*>::operator*(&__end1);
    this = (EOClient *)*ppCVar3;
    if ((this->needpong & 1U) == 0) {
      EOClient::PingNewSequence(this);
      pVar2 = EOClient::GetSeqUpdateBytes(this);
      builder.add_size._4_2_ = pVar2.first;
      builder.add_size._6_1_ = pVar2.second;
      PacketBuilder::PacketBuilder((PacketBuilder *)local_78,PACKET_CONNECTION,PACKET_PLAYER,3);
      PacketBuilder::AddShort((PacketBuilder *)local_78,(uint)builder.add_size._4_2_);
      PacketBuilder::AddChar((PacketBuilder *)local_78,(uint)builder.add_size._6_1_);
      this->needpong = true;
      EOClient::Send(this,(PacketBuilder *)local_78);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_78);
    }
    else {
      Client::Close((Client *)this,false);
    }
    std::_List_iterator<Client_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void server_ping_all(void *server_void)
{
	EOServer *server = static_cast<EOServer *>(server_void);

	UTIL_FOREACH(server->clients, rawclient)
	{
		EOClient *client = static_cast<EOClient *>(rawclient);

		if (client->needpong)
		{
			client->Close();
		}
		else
		{
			client->PingNewSequence();
			auto seq_bytes = client->GetSeqUpdateBytes();

			PacketBuilder builder(PACKET_CONNECTION, PACKET_PLAYER, 3);
			builder.AddShort(seq_bytes.first);
			builder.AddChar(seq_bytes.second);

			client->needpong = true;
			client->Send(builder);
		}
	}
}